

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O1

int get_monster_id(char *s,char c)

{
  char *__s2;
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  if (c == '\0') {
    iVar1 = 0;
  }
  else {
    iVar1 = def_char_to_monclass(c);
  }
  if (iVar1 != 0x3d) {
    pcVar3 = &mons[0].mlet;
    lVar4 = 0;
    do {
      if (((iVar1 == 0) || (iVar1 == *pcVar3)) &&
         (iVar2 = strcmp(s,((permonst *)(pcVar3 + -8))->mname), iVar2 == 0)) {
        return (int)lVar4;
      }
      lVar4 = lVar4 + 1;
      pcVar3 = pcVar3 + 0x40;
    } while (lVar4 != 0x193);
    pcVar3 = &mons[0].mlet;
    lVar4 = 0;
    do {
      if ((iVar1 == 0) || (iVar1 == *pcVar3)) {
        __s2 = ((permonst *)(pcVar3 + -8))->mname;
        iVar2 = strcasecmp(s,__s2);
        if (iVar2 == 0) {
          if (be_verbose != 0) {
            lc_warning("Monster type \"%s\" matches \"%s\".",s,__s2);
          }
          return (int)lVar4;
        }
      }
      lVar4 = lVar4 + 1;
      pcVar3 = pcVar3 + 0x40;
    } while (lVar4 != 0x193);
  }
  return -1;
}

Assistant:

int get_monster_id(char *s, char c)
{
	int i, class;

	class = c ? def_char_to_monclass(c) : 0;
	if (class == MAXMCLASSES) return ERR;

	for (i = LOW_PM; i < NUMMONS; i++)
	    if (!class || class == mons[i].mlet)
		if (!strcmp(s, mons[i].mname)) return i;
	/* didn't find it; lets try case insensitive search */
	for (i = LOW_PM; i < NUMMONS; i++) {
	    if (!class || class == mons[i].mlet) {
		if (!strcasecmp(s, mons[i].mname)) {
		    if (be_verbose)
			lc_warning("Monster type \"%s\" matches \"%s\".",
				   s, mons[i].mname);
		    return i;
		}
	    }
	}
	return ERR;
}